

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Corrade::Containers::
  arrayAppend<std::pair<std::__cxx11::string,std::__cxx11::string>,Corrade::Containers::ArrayNewAllocator<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::__cxx11::string,std::__cxx11::string>
            (Array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(*)(std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_unsigned_long)>
             *array,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_3)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  
  this = Implementation::
         arrayGrowBy<std::pair<std::__cxx11::string,std::__cxx11::string>,Corrade::Containers::ArrayNewAllocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                   (array,1);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,param_2,param_3);
  return this;
}

Assistant:

T& arrayAppend(Array<T>& array, Corrade::InPlaceInitT, Args&&... args) {
    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, 1);
    /* No helper function as there's no way we could memcpy such a thing. */
    /* On GCC 4.8 this includes another workaround, see the 4.8-specific
       overload docs for details */
    Implementation::construct(*it, Utility::forward<Args>(args)...);
    return *it;
}